

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall ThreadData::runInThread(ThreadData *this)

{
  int iVar1;
  undefined8 uVar2;
  long *in_FS_OFFSET;
  ThreadData *this_local;
  
  iVar1 = CurrentThread::tid();
  *this->tid_ = iVar1;
  this->tid_ = (pid_t *)0x0;
  CountDownLatch::countDown(this->latch_);
  this->latch_ = (CountDownLatch *)0x0;
  uVar2 = std::__cxx11::string::c_str();
  *(undefined8 *)(*in_FS_OFFSET + -0x48) = uVar2;
  prctl(0xf,*(undefined8 *)(*in_FS_OFFSET + -0x48));
  std::function<void_()>::operator()(&this->func_);
  return;
}

Assistant:

void runInThread() {
        *tid_ = CurrentThread::tid();
        tid_ = NULL;
        latch_->countDown();
        latch_ = NULL;

        CurrentThread::t_threadName = name_.c_str();
        prctl(PR_SET_NAME, CurrentThread::t_threadName);
        func_();
        
    }